

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Value fmt::internal::ArgArray<1u,true>::
      make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,std::__cxx11::string>
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  anon_union_16_12_986ea841_for_Value_0 aVar1;
  Value result;
  undefined8 local_48;
  undefined8 uStackY_40;
  string *in_stack_ffffffffffffffc8;
  MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_> *in_stack_ffffffffffffffd0;
  
  MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_>::MakeValue
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  aVar1.string.size = uStackY_40;
  aVar1.long_long_value = local_48;
  return (anon_union_16_12_986ea841_for_Value_0)(anon_union_16_12_986ea841_for_Value_0)aVar1.string;
}

Assistant:

static Value make(const T &value) {
#ifdef __clang__
    Value result = MakeValue<Formatter>(value);
    // Workaround a bug in Apple LLVM version 4.2 (clang-425.0.28) of clang:
    // https://github.com/fmtlib/fmt/issues/276
    (void)result.custom.format;
    return result;
#else
    return MakeValue<Formatter>(value);
#endif
  }